

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_04.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  istream *this;
  ostream *poVar1;
  int local_20;
  int local_1c;
  int number2;
  int number1;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _number2 = argv;
  argv_local._0_4_ = argc;
  std::operator<<((ostream *)&std::cout,"Enter two integers to compare: ");
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_1c);
  std::istream::operator>>(this,&local_20);
  if (local_1c == local_20) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar1 = std::operator<<(poVar1," == ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (local_1c != local_20) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar1 = std::operator<<(poVar1," != ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (local_1c < local_20) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar1 = std::operator<<(poVar1," < ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (local_20 < local_1c) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar1 = std::operator<<(poVar1," > ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (local_1c <= local_20) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar1 = std::operator<<(poVar1," <= ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (local_20 <= local_1c) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar1 = std::operator<<(poVar1," >= ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    int number1;
    int number2;

    std::cout << "Enter two integers to compare: ";  // prompt user for data
    std::cin >> number1 >> number2;  // read two integers from user

    if (number1 == number2)
        std::cout << number1 << " == " << number2 << std::endl;

    if (number1 != number2)
        std::cout << number1 << " != " << number2 << std::endl;

    if (number1 < number2)
        std::cout << number1 << " < " << number2 << std::endl;

    if (number1 > number2)
        std::cout << number1 << " > " << number2 << std::endl;

    if (number1 <= number2)
        std::cout << number1 << " <= " << number2 << std::endl;

    if (number1 >= number2)
        std::cout << number1 << " >= " << number2 << std::endl;

    return 0;
}